

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::Init(SQVM *this,SQVM *friendvm,SQInteger stacksize)

{
  CallInfo *pCVar1;
  SQSharedState *ss;
  long in_RSI;
  long in_RDI;
  SQInteger in_stack_ffffffffffffff38;
  SQObjectPtr *in_stack_ffffffffffffff40;
  SQUnsignedInteger in_stack_ffffffffffffff48;
  SQTable *x;
  sqvector<SQObjectPtr> *in_stack_ffffffffffffff50;
  sqvector<SQVM::CallInfo> *this_00;
  sqvector<SQVM::CallInfo> local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  SQObjectPtr local_28;
  long local_10;
  
  local_10 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(&local_28);
  sqvector<SQObjectPtr>::resize
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  ::SQObjectPtr::~SQObjectPtr(in_stack_ffffffffffffff40);
  *(undefined8 *)(in_RDI + 0xd0) = 4;
  ss = (SQSharedState *)(in_RDI + 0xd8);
  x = *(SQTable **)(in_RDI + 0xd0);
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_88._allocated = 0;
  uStack_70 = 0;
  local_88._vals = (CallInfo *)0x0;
  local_88._size = 0;
  local_48 = 0;
  this_00 = &local_88;
  CallInfo::CallInfo((CallInfo *)0x143174);
  sqvector<SQVM::CallInfo>::resize(this_00,(SQUnsignedInteger)x,(CallInfo *)ss);
  CallInfo::~CallInfo((CallInfo *)0x143194);
  *(undefined8 *)(in_RDI + 200) = 0;
  pCVar1 = sqvector<SQVM::CallInfo>::operator[]((sqvector<SQVM::CallInfo> *)(in_RDI + 0xd8),0);
  *(CallInfo **)(in_RDI + 0xc0) = pCVar1;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  if (local_10 == 0) {
    SQTable::Create(ss,in_stack_ffffffffffffff38);
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,x);
    sq_base_register((HSQUIRRELVM)ss);
  }
  else {
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObjectPtr *)x);
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObjectPtr *)x);
    *(byte *)(in_RDI + 0x90) = *(byte *)(local_10 + 0x90) & 1;
    *(undefined8 *)(in_RDI + 0x98) = *(undefined8 *)(local_10 + 0x98);
    ::SQObjectPtr::operator=((SQObjectPtr *)this_00,(SQObjectPtr *)x);
  }
  return true;
}

Assistant:

bool SQVM::Init(SQVM *friendvm, SQInteger stacksize)
{
    _stack.resize(stacksize);
    _alloccallsstacksize = 4;
    _callstackdata.resize(_alloccallsstacksize);
    _callsstacksize = 0;
    _callsstack = &_callstackdata[0];
    _stackbase = 0;
    _top = 0;
    if(!friendvm) {
        _roottable = SQTable::Create(_ss(this), 0);
        sq_base_register(this);
    }
    else {
        _roottable = friendvm->_roottable;
        _errorhandler = friendvm->_errorhandler;
        _debughook = friendvm->_debughook;
        _debughook_native = friendvm->_debughook_native;
        _debughook_closure = friendvm->_debughook_closure;
    }


    return true;
}